

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::StackIRGenerator>::visitBlock
          (BinaryenIRWriter<wasm::StackIRGenerator> *this,Block *curr)

{
  bool bVar1;
  bool bVar2;
  Expression **ppEVar3;
  reference ppBVar4;
  BasicType local_6c;
  Block *local_68;
  Block *parent;
  bool local_55;
  bool childUnreachable;
  Block *local_48;
  Block *child;
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> parents;
  anon_class_8_1_8991fb9c afterChildren;
  anon_class_8_1_8991fb9c visitChildren;
  Block *curr_local;
  BinaryenIRWriter<wasm::StackIRGenerator> *this_local;
  
  afterChildren.this = this;
  visitChildren.this = (BinaryenIRWriter<wasm::StackIRGenerator> *)curr;
  bVar1 = IString::is(&(curr->name).super_IString);
  if (bVar1) {
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       (visitChildren.this + 4));
    if (!bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (visitChildren.this + 4),0);
      bVar1 = Expression::is<wasm::Block>(*ppEVar3);
      if (bVar1) {
        std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::vector
                  ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)&child);
        while( true ) {
          bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(visitChildren.this + 4));
          bVar1 = false;
          if (!bVar2) {
            ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)(visitChildren.this + 4),0);
            local_48 = Expression::dynCast<wasm::Block>(*ppEVar3);
            bVar1 = local_48 != (Block *)0x0;
          }
          if (!bVar1) break;
          std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
                    ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)&child,
                     (value_type *)&visitChildren);
          emit(this,(Expression *)visitChildren.this);
          visitChildren.this = (BinaryenIRWriter<wasm::StackIRGenerator> *)local_48;
          emitDebugLocation(this,(Expression *)local_48);
        }
        emit(this,(Expression *)visitChildren.this);
        visitBlock::anon_class_8_1_8991fb9c::operator()
                  (&afterChildren,(Block *)visitChildren.this,0);
        visitBlock::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)
                   &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Block *)visitChildren.this);
        parent._4_4_ = 1;
        local_55 = wasm::Type::operator==
                             ((Type *)(visitChildren.this + 1),(BasicType *)((long)&parent + 4));
        while (bVar1 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::empty
                                 ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)&child),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          ppBVar4 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::back
                              ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)&child);
          local_68 = *ppBVar4;
          std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::pop_back
                    ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)&child);
          if ((local_55 & 1U) == 0) {
            visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,local_68,1);
          }
          visitBlock::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,local_68);
          local_6c = unreachable;
          local_55 = wasm::Type::operator==
                               (&(local_68->super_SpecificExpression<(wasm::Expression::Id)1>).
                                 super_Expression.type,&local_6c);
        }
        std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~vector
                  ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)&child);
        return;
      }
    }
    emit(this,(Expression *)visitChildren.this);
    visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,(Block *)visitChildren.this,0);
    visitBlock::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)
               &parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Block *)visitChildren.this);
  }
  else {
    visitBlock::anon_class_8_1_8991fb9c::operator()(&afterChildren,(Block *)visitChildren.this,0);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitBlock(Block* curr) {
  auto visitChildren = [this](Block* curr, Index from) {
    auto& list = curr->list;
    while (from < list.size()) {
      auto* child = list[from];
      visit(child);
      if (child->type == Type::unreachable) {
        break;
      }
      ++from;
    }
  };

  // A block with no name never needs to be emitted: we can just emit its
  // contents. In some cases that will end up as "stacky" code, which is valid
  // in wasm but not in Binaryen IR. This is similar to what we do in
  // visitPossibleBlockContents(), and like there, when we reload such a binary
  // we'll end up creating a block for it then.
  //
  // Note that in visitPossibleBlockContents() we also optimize the case of a
  // block with a name but the name actually has no uses - that handles more
  // cases, but it requires more work. It is reasonable to do it in
  // visitPossibleBlockContents() which handles the common cases of blocks that
  // are children of control flow structures (like an if arm); doing it here
  // would affect every block, including highly-nested block stacks, which would
  // end up as quadratic time. In optimized code the name will not exist if it's
  // not used anyhow, so a minor optimization for the unoptimized case that
  // leads to potential quadratic behavior is not worth it here.
  if (!curr->name.is()) {
    visitChildren(curr, 0);
    return;
  }

  auto afterChildren = [this](Block* curr) {
    emitScopeEnd(curr);
    if (curr->type == Type::unreachable) {
      // Since this block is unreachable, no instructions will be emitted after
      // it in its enclosing scope. That means that this block will be the last
      // instruction before the end of its parent scope, so its type must match
      // the type of its parent. But we don't have a concrete type for this
      // block and we don't know what type its parent expects, so we can't
      // ensure the types match. To work around this, we insert an `unreachable`
      // instruction after every unreachable control flow structure and depend
      // on its polymorphic behavior to paper over any type mismatches.
      emitUnreachable();
    }
  };

  // Handle very deeply nested blocks in the first position efficiently,
  // avoiding heavy recursion. We only start to do this if we see it will help
  // us (to avoid allocation of the vector).
  if (!curr->list.empty() && curr->list[0]->is<Block>()) {
    std::vector<Block*> parents;
    Block* child;
    while (!curr->list.empty() && (child = curr->list[0]->dynCast<Block>())) {
      parents.push_back(curr);
      emit(curr);
      curr = child;
      emitDebugLocation(curr);
    }
    // Emit the current block, which does not have a block as a child in the
    // first position.
    emit(curr);
    visitChildren(curr, 0);
    afterChildren(curr);
    bool childUnreachable = curr->type == Type::unreachable;
    // Finish the later parts of all the parent blocks.
    while (!parents.empty()) {
      auto* parent = parents.back();
      parents.pop_back();
      if (!childUnreachable) {
        visitChildren(parent, 1);
      }
      afterChildren(parent);
      childUnreachable = parent->type == Type::unreachable;
    }
    return;
  }
  // Simple case of not having a nested block in the first position.
  emit(curr);
  visitChildren(curr, 0);
  afterChildren(curr);
}